

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
reserve(vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
        *this,size_t n)

{
  Bin *pBVar1;
  Bin *pBVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  if (this->nAlloc < n) {
    pBVar2 = pmr::polymorphic_allocator<pbrt::AliasTable::Bin>::
             allocate_object<pbrt::AliasTable::Bin>(&this->alloc,n);
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < this->nStored; uVar4 = uVar4 + 1) {
      pBVar1 = this->ptr;
      *(undefined4 *)((long)&pBVar2->alias + lVar3) = *(undefined4 *)((long)&pBVar1->alias + lVar3);
      *(undefined8 *)((long)&pBVar2->q + lVar3) = *(undefined8 *)((long)&pBVar1->q + lVar3);
      lVar3 = lVar3 + 0xc;
    }
    pmr::polymorphic_allocator<pbrt::AliasTable::Bin>::deallocate_object<pbrt::AliasTable::Bin>
              (&this->alloc,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pBVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }